

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleDataType(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((((((kind == Identifier) || (kind == OpenBracket)) || (kind == BitKeyword)) ||
        (((kind == ByteKeyword || (kind == CHandleKeyword)) ||
         ((kind == ConstKeyword ||
          (((ushort)(kind - EnumKeyword) < 2 || ((ushort)(kind - IntKeyword) < 2)))))))) ||
       (((ushort)(kind - LogicKeyword) < 2 ||
        ((((ushort)(kind - RealKeyword) < 2 || (kind == RegKeyword)) ||
         ((ushort)(kind - ShortIntKeyword) < 2)))))) ||
      (((kind == SignedKeyword || (kind == StringKeyword)) ||
       (((kind == StructKeyword || ((kind == TimeKeyword || (kind == TypeKeyword)))) ||
        (kind == UnionKeyword)))))) ||
     (((kind == UnsignedKeyword || ((ushort)(kind - VirtualKeyword) < 2)) ||
      (kind == UnitSystemName)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleDataType(TokenKind kind) {
    switch (kind) {
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword:
        case TokenKind::StringKeyword:
        case TokenKind::ConstKeyword:
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::VirtualKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::VoidKeyword:
        case TokenKind::Identifier:
        case TokenKind::UnitSystemName:
        case TokenKind::OpenBracket:
            return true;
        default:
            return false;
    }
}